

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm_distorm.c
# Opt level: O2

int funchook_disasm_init
              (funchook_disasm_t *disasm,funchook_t *funchook,uint8_t *code,size_t code_size,
              size_t address)

{
  _DecodeResult _Var1;
  int iVar2;
  
  disasm->funchook = funchook;
  (disasm->ci).codeOffset = address;
  (disasm->ci).code = code;
  (disasm->ci).codeLen = (int)code_size;
  (disasm->ci).dt = Decode64Bits;
  (disasm->ci).features = 0x10;
  disasm->idx = 0;
  _Var1 = distorm_decompose64(&disasm->ci,disasm->dis,0x100,&disasm->cnt);
  iVar2 = 0;
  if (_Var1 != DECRES_SUCCESS) {
    funchook_set_error_message(funchook,"Disassemble Error: %d",(ulong)_Var1);
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

int funchook_disasm_init(funchook_disasm_t *disasm, funchook_t *funchook, const uint8_t *code, size_t code_size, size_t address)
{
    _DecodeResult decres;

    disasm->funchook = funchook;
    disasm->ci.codeOffset = address;
    disasm->ci.code = code;
    disasm->ci.codeLen = (int)code_size;
#ifdef CPU_X86_64
    disasm->ci.dt = Decode64Bits;
#else
    disasm->ci.dt = Decode32Bits;
#endif
    disasm->ci.features = DF_STOP_ON_RET;
    disasm->idx = 0;
    decres = distorm_decompose64(&disasm->ci, disasm->dis, MAX_INSN_CHECK_SIZE, &disasm->cnt);
    if (decres != DECRES_SUCCESS) {
        funchook_set_error_message(funchook, "Disassemble Error: %d", decres);
        return FUNCHOOK_ERROR_DISASSEMBLY;
    }
    return 0;
}